

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O1

bool __thiscall
helics::MessageTimer::addTimeToTimer(MessageTimer *this,int32_t timerIndex,nanoseconds time)

{
  implementation_type *impl;
  action_t aVar1;
  pointer psVar2;
  element_type *peVar3;
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *pdVar4;
  ulong uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  int iVar7;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_asio::any_io_executor>
  *op;
  op_cancellation *poVar8;
  pthread_mutex_t *__mutex;
  undefined8 uVar9;
  long lVar10;
  long *in_FS_OFFSET;
  bool bVar11;
  associated_cancellation_slot_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30)>
  slot;
  type timerCallback;
  type local_a8;
  pthread_mutex_t *local_90;
  ptr local_88;
  cancellation_slot local_70;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  int32_t local_58;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_asio::any_io_executor>
  *local_50;
  ulong local_48;
  per_timer_data *local_40;
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *local_38;
  
  uVar5 = (ulong)(uint)timerIndex;
  __mutex = (pthread_mutex_t *)&this->timerLock;
  iVar7 = pthread_mutex_lock(__mutex);
  if (iVar7 == 0) {
    if ((timerIndex < 0) ||
       (psVar2 = (this->timers).
                 super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (int)((ulong)((long)(this->timers).
                           super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2) >> 4) <=
       timerIndex)) {
      bVar11 = false;
    }
    else {
      peVar3 = psVar2[uVar5].
               super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      impl = (implementation_type *)((long)&peVar3->impl_ + 8);
      lVar10 = time.__r + *(long *)&((implementation_type *)((long)&peVar3->impl_ + 8))->expiry;
      local_88.h = (type *)((ulong)local_88.h & 0xffffffff00000000);
      local_90 = __mutex;
      local_48 = uVar5;
      local_88.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_asio::any_io_executor>
                    *)std::_V2::system_category();
      local_50 = local_88.v;
      ::asio::detail::
      deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
      ::cancel((peVar3->impl_).service_,impl,(error_code *)&local_88);
      (impl->expiry).__d.__r = lVar10;
      std::__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<helics::MessageTimer,void>
                ((__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 (__weak_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2> *)this);
      (this->expirationTimes).
      super__Vector_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[local_48].__d.__r = lVar10;
      aVar1 = (this->buffers).
              super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
              _M_impl.super__Vector_impl_data._M_start[local_48].messageAction;
      peVar3 = (this->timers).
               super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5].
               super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_a8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_68;
      local_a8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60;
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_60->_M_use_count = local_60->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_60->_M_use_count = local_60->_M_use_count + 1;
        }
      }
      pdVar4 = (peVar3->impl_).service_;
      local_70.handler_ = (cancellation_handler_base **)0x0;
      if (*(long *)(*in_FS_OFFSET + -0x2860) == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x2860) + 8);
      }
      local_a8.timerIndex = timerIndex;
      local_88.h = &local_a8;
      local_58 = timerIndex;
      op = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_asio::any_io_executor>
            *)::asio::detail::thread_info_base::
              allocate<asio::detail::thread_info_base::default_tag>(uVar9,0x80,8);
      _Var6._M_pi = local_a8.ptr.
                    super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi;
      local_88.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_asio::any_io_executor>
                    *)0x0;
      (op->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
      (op->super_wait_op).super_operation.func_ =
           ::asio::detail::
           wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:115:30),_asio::any_io_executor>
           ::do_complete;
      (op->super_wait_op).super_operation.task_result_ = 0;
      (op->super_wait_op).ec_._M_value = 0;
      (op->super_wait_op).ec_._M_cat = (error_category *)local_50;
      (op->super_wait_op).cancellation_key_ = (void *)0x0;
      (op->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_a8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (op->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = local_a8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
      (op->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var6._M_pi;
      local_a8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (op->handler_).timerIndex = local_a8.timerIndex;
      local_88.v = op;
      ::asio::detail::
      handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
      handler_work_base(&(op->work_).
                         super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                        ,0,0,(executor_type *)((long)&peVar3->impl_ + 0x40));
      local_88.p = op;
      if (local_70.handler_ != (cancellation_handler_base **)0x0) {
        local_40 = (per_timer_data *)((long)&peVar3->impl_ + 0x18);
        local_38 = pdVar4;
        poVar8 = ::asio::cancellation_slot::
                 emplace<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>::op_cancellation,asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>*,asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>::per_timer_data*>
                           (&local_70,&local_38,&local_40);
        (op->super_wait_op).cancellation_key_ = poVar8;
      }
      *(bool *)((long)&peVar3->impl_ + 0x10) = true;
      ::asio::detail::epoll_reactor::
      schedule_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                ((epoll_reactor *)pdVar4->scheduler_,&pdVar4->timer_queue_,
                 (time_type *)((long)&peVar3->impl_ + 8),
                 (per_timer_data *)((long)&peVar3->impl_ + 0x18),(wait_op *)op);
      local_88.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_asio::any_io_executor>
                    *)0x0;
      local_88.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:115:30),_asio::any_io_executor>
                    *)0x0;
      ::asio::detail::
      wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:115:30),_asio::any_io_executor>
      ::ptr::reset(&local_88);
      __mutex = local_90;
      if (local_a8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      bVar11 = aVar1 != cmd_ignore;
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
    }
    pthread_mutex_unlock(__mutex);
    return bVar11;
  }
  std::__throw_system_error(iVar7);
}

Assistant:

bool MessageTimer::addTimeToTimer(int32_t timerIndex, std::chrono::nanoseconds time)
{
    std::lock_guard<std::mutex> lock(timerLock);
    if ((timerIndex >= 0) && (timerIndex < static_cast<int32_t>(timers.size()))) {
        auto newTime = timers[timerIndex]->expires_at() + time;
        timers[timerIndex]->expires_at(newTime);
        auto timerCallback = [ptr = shared_from_this(), timerIndex](const std::error_code& ec) {
            processTimerCallback(ptr, timerIndex, ec);
        };
        expirationTimes[timerIndex] = newTime;
        auto ret = (buffers[timerIndex].action() != CMD_IGNORE);
        timers[timerIndex]->async_wait(timerCallback);
        return ret;
    }
    return false;
}